

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contacts.cpp
# Opt level: O1

void __thiscall IContactList::AddContact(IContactList *this,char *pName,char *pClan)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  
  if ((this->m_NumContacts != 0x80) && ((*pName != '\0' || (*pClan != '\0')))) {
    uVar2 = str_quickhash(pName);
    uVar3 = str_quickhash(pClan);
    lVar4 = (long)this->m_NumContacts;
    if (0 < lVar4) {
      lVar5 = 0;
      do {
        if ((*(uint *)(this->m_aContacts[0].m_aClan + lVar5 + 0x33) == uVar2) &&
           (*(uint *)(this->m_aContacts[0].m_aClan + lVar5 + 0x37) == uVar3)) {
          return;
        }
        lVar5 = lVar5 + 0x7c;
      } while (lVar4 * 0x7c - lVar5 != 0);
    }
    str_utf8_copy_num(this->m_aContacts[lVar4].m_aName,pName,0x41,0x10);
    str_utf8_copy_num(this->m_aContacts[this->m_NumContacts].m_aClan,pClan,0x31,0xc);
    iVar1 = this->m_NumContacts;
    this->m_aContacts[iVar1].m_NameHash = uVar2;
    this->m_aContacts[iVar1].m_ClanHash = uVar3;
    this->m_NumContacts = iVar1 + 1;
  }
  return;
}

Assistant:

void IContactList::AddContact(const char *pName, const char *pClan)
{
	if(m_NumContacts == CContactInfo::MAX_CONTACTS || (pName[0] == 0 && pClan[0] == 0))
		return;

	// make sure we don't have the friend already
	unsigned NameHash = str_quickhash(pName);
	unsigned ClanHash = str_quickhash(pClan);
	for(int i = 0; i < m_NumContacts; ++i)
	{
		if(m_aContacts[i].m_NameHash == NameHash && m_aContacts[i].m_ClanHash == ClanHash)
			return;
	}

	str_utf8_copy_num(m_aContacts[m_NumContacts].m_aName, pName, sizeof(m_aContacts[m_NumContacts].m_aName), MAX_NAME_LENGTH);
	str_utf8_copy_num(m_aContacts[m_NumContacts].m_aClan, pClan, sizeof(m_aContacts[m_NumContacts].m_aClan), MAX_CLAN_LENGTH);
	m_aContacts[m_NumContacts].m_NameHash = NameHash;
	m_aContacts[m_NumContacts].m_ClanHash = ClanHash;
	++m_NumContacts;
}